

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

uint16_t ucnv_countAliases_63(char *alias,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  UBool UVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  bool bVar14;
  char local_78 [72];
  
  UVar6 = haveAliasData(pErrorCode);
  if (UVar6 == '\0') {
    return 0;
  }
  if (alias == (char *)0x0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if (*alias == '\0') {
    return 0;
  }
  uVar1 = (gMainTable.optionTable)->stringNormalizationType;
  if (uVar1 != 0) {
    sVar9 = strlen(alias);
    if (0x3b < sVar9) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002beb3d;
    }
    ucnv_io_stripASCIIForCompare_63(local_78,alias);
    alias = local_78;
  }
  puVar5 = gMainTable.normalizedStringTable;
  puVar4 = gMainTable.stringTable;
  puVar3 = gMainTable.aliasList;
  uVar11 = 0;
  uVar12 = gMainTable.untaggedConvArraySize;
  uVar13 = gMainTable.untaggedConvArraySize >> 1;
  do {
    if (uVar1 == 0) {
      iVar7 = ucnv_compareNames_63(alias,(char *)(puVar4 + puVar3[uVar13]));
    }
    else {
      iVar7 = strcmp(alias,(char *)(puVar5 + puVar3[uVar13]));
    }
    uVar8 = uVar13;
    if ((-1 < iVar7) && (uVar8 = uVar12, uVar11 = uVar13, iVar7 == 0)) {
      uVar2 = gMainTable.untaggedConvArray[uVar13];
      if ((short)uVar2 < 0) {
        *pErrorCode = U_AMBIGUOUS_ALIAS_WARNING;
      }
      uVar10 = (ulong)(uVar2 & 0xfff);
      goto LAB_002beb64;
    }
    uVar12 = uVar8;
    uVar8 = uVar12 + uVar11 >> 1;
    bVar14 = uVar13 != uVar8;
    uVar13 = uVar8;
  } while (bVar14);
LAB_002beb3d:
  uVar10 = 0xffffffff;
LAB_002beb64:
  if ((uint)uVar10 < gMainTable.converterListSize) {
    uVar10 = (ulong)gMainTable.taggedAliasArray
                    [(gMainTable.tagListSize - 1) * gMainTable.converterListSize + (uint)uVar10];
    bVar14 = uVar10 == 0;
    if (!bVar14) {
      uVar10 = (ulong)gMainTable.taggedAliasLists[uVar10];
      bVar14 = false;
    }
  }
  else {
    bVar14 = true;
  }
  if (bVar14) {
    return 0;
  }
  return (uint16_t)uVar10;
}

Assistant:

U_CAPI uint16_t U_EXPORT2
ucnv_countAliases(const char *alias, UErrorCode *pErrorCode)
{
    return ucnv_io_countAliases(alias, pErrorCode);
}